

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O2

vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
* __thiscall
reed_solomn::poly_align
          (vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
           *__return_storage_ptr__,reed_solomn *this,vector<__int128,_std::allocator<__int128>_> *A,
          vector<__int128,_std::allocator<__int128>_> *b)

{
  int iVar1;
  bool bVar2;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar1 = (int)((ulong)((long)(A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 4) -
          (int)((ulong)((long)(b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 4);
  (__return_storage_ptr__->
  super__Vector_base<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      local_38 = 0;
      uStack_30 = 0;
      std::vector<__int128,_std::allocator<__int128>_>::emplace_back<__int128>
                (A,(__int128 *)&local_38);
    }
  }
  else {
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      local_38 = 0;
      uStack_30 = 0;
      std::vector<__int128,_std::allocator<__int128>_>::emplace_back<__int128>
                (b,(__int128 *)&local_38);
    }
  }
  std::
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  ::push_back(__return_storage_ptr__,A);
  std::
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  ::push_back(__return_storage_ptr__,b);
  return __return_storage_ptr__;
}

Assistant:

vector<vector<ll128>> reed_solomn::poly_align(vector<ll128> A, vector<ll128> b) {
    int diff = A.size() - b.size();
    vector<vector<ll128>> res;
    if (diff > 0) {
        for (int i = 0; i < diff; ++i) {
            b.push_back(0);
        }
    } else {
        diff = -diff;
        for (int i = 0; i < diff; ++i) {
            A.push_back(0);
        }
    }
    res.push_back(A);
    res.push_back(b);
    return res;
}